

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>
::fastAccessDx(FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>
               *this,int i)

{
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar1;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar2;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar4;
  
  pFVar1 = (this->left_->fadexpr_).left_;
  pFVar2 = (this->left_->fadexpr_).right_;
  pFVar3 = (pFVar1->fadexpr_).left_;
  pFVar4 = (pFVar1->fadexpr_).right_;
  return (((pFVar2->fadexpr_).right_)->dx_).ptr_to_data[i] * (pFVar2->fadexpr_).left_.constant_ +
         (((pFVar4->fadexpr_).right_)->dx_).ptr_to_data[i] * (pFVar4->fadexpr_).left_.constant_ +
         (((pFVar3->fadexpr_).right_)->dx_).ptr_to_data[i] * (pFVar3->fadexpr_).left_.constant_;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i);}